

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_test.cpp
# Opt level: O1

void __thiscall
CheckedSharedMutexTest_InvalidUnlockShared0_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
::TestBody(CheckedSharedMutexTest_InvalidUnlockShared0_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
           *this)

{
  bool bVar1;
  TrueWithString gtest_msg;
  TypeParam mtx;
  AssertHelper local_e0;
  char *local_d8;
  char *pcStack_d0;
  char local_c8 [16];
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8 [4];
  shared_mutex_base<yamc::rwlock::ReaderPrefer> local_98;
  
  yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::basic_shared_timed_mutex
            ((basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *)&local_98);
  local_c8[8] = '\0';
  local_c8[9] = '\0';
  local_c8[10] = '\0';
  local_c8[0xb] = '\0';
  local_c8[0xc] = '\0';
  local_c8[0xd] = '\0';
  local_c8[0xe] = '\0';
  local_c8[0xf] = '\0';
  pcStack_d0 = (char *)0x0;
  local_c8[0] = '\0';
  local_c8[1] = '\0';
  local_c8[2] = '\0';
  local_c8[3] = '\0';
  local_c8[4] = '\0';
  local_c8[5] = '\0';
  local_c8[6] = '\0';
  local_c8[7] = '\0';
  local_d8 = local_c8;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::unlock_shared(&local_98);
  }
  std::__cxx11::string::_M_replace((ulong)&local_d8,0,pcStack_d0,0x1c3901);
  testing::Message::Message((Message *)local_b8);
  testing::internal::AssertHelper::AssertHelper
            (&local_e0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
             ,0x163,local_d8);
  testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_b8);
  testing::internal::AssertHelper::~AssertHelper(&local_e0);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_b8[0]._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_b8[0]._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8);
  }
  yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::~basic_shared_timed_mutex
            ((basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *)&local_98);
  return;
}

Assistant:

TYPED_TEST(CheckedSharedMutexTest, InvalidUnlockShared0) {
  TypeParam mtx;
  EXPECT_CHECK_FAILURE(mtx.unlock_shared());
}